

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O2

void do_test(uv_udp_recv_cb recv_cb,int bind_flags)

{
  ushort uVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  sockaddr_in addr;
  int addr_len;
  int addr6_len;
  sockaddr_in6 addr6;
  undefined1 local_138 [16];
  char dst [256];
  
  iVar2 = uv_ip6_addr("::0",0x23a3,&addr6);
  if (iVar2 == 0) {
    uVar3 = uv_default_loop();
    iVar2 = uv_udp_init(uVar3,&server);
    if (iVar2 == 0) {
      iVar2 = uv_udp_bind(&server,&addr6,bind_flags);
      if (iVar2 == 0) {
        iVar2 = uv_udp_getsockname(&server,&addr6);
        if (iVar2 == 0) {
          iVar2 = uv_inet_ntop(addr6.sin6_family,&addr6.sin6_addr,dst,0x100);
          if (iVar2 == 0) {
            printf("on [%.*s]:%d\n",0x100,dst,(ulong)addr6.sin6_port);
            iVar2 = uv_udp_recv_start(&server,alloc_cb,recv_cb);
            if (iVar2 == 0) {
              uVar3 = uv_default_loop();
              iVar2 = uv_udp_init(uVar3,&client);
              if (iVar2 == 0) {
                iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
                if (iVar2 == 0) {
                  iVar2 = uv_inet_ntop(addr.sin_family,&addr.sin_addr,dst,0x100);
                  if (iVar2 == 0) {
                    printf("to [%.*s]:%d\n",0x100,dst,(ulong)addr.sin_port);
                    uVar1 = uv_os_getpid();
                    iVar2 = snprintf(data,10,"PING%5u",(ulong)uVar1);
                    if (iVar2 == 9) {
                      local_138 = uv_buf_init(data,9);
                      printf("sending %s\n",data);
                      iVar2 = uv_udp_send(&req_,&client,local_138,1,&addr,send_cb);
                      if (iVar2 == 0) {
                        iVar2 = uv_udp_getsockname(&client,&addr);
                        if (iVar2 == 0) {
                          iVar2 = uv_inet_ntop(addr.sin_family,&addr.sin_addr,dst,0x100);
                          if (iVar2 == 0) {
                            printf("from [%.*s]:%d\n",0x100,dst,(ulong)addr.sin_port);
                            client_port = addr.sin_port;
                            uVar3 = uv_default_loop();
                            iVar2 = uv_timer_init(uVar3,&timeout);
                            if (iVar2 == 0) {
                              iVar2 = uv_timer_start(&timeout,timeout_cb,500,0);
                              if (iVar2 == 0) {
                                if (close_cb_called == 0) {
                                  if (send_cb_called == 0) {
                                    if (recv_cb_called == 0) {
                                      uVar3 = uv_default_loop();
                                      uv_run(uVar3,0);
                                      if (close_cb_called == 3) {
                                        uVar3 = uv_default_loop();
                                        uv_walk(uVar3,close_walk_cb,0);
                                        uv_run(uVar3,0);
                                        uVar3 = uv_default_loop();
                                        iVar2 = uv_loop_close(uVar3);
                                        if (iVar2 == 0) {
                                          uv_library_shutdown();
                                          return;
                                        }
                                        pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                                        uVar3 = 0xd2;
                                      }
                                      else {
                                        pcVar4 = "close_cb_called == 3";
                                        uVar3 = 0xd0;
                                      }
                                    }
                                    else {
                                      pcVar4 = "recv_cb_called == 0";
                                      uVar3 = 0xcc;
                                    }
                                  }
                                  else {
                                    pcVar4 = "send_cb_called == 0";
                                    uVar3 = 0xcb;
                                  }
                                }
                                else {
                                  pcVar4 = "close_cb_called == 0";
                                  uVar3 = 0xca;
                                }
                              }
                              else {
                                pcVar4 = "r == 0";
                                uVar3 = 200;
                              }
                            }
                            else {
                              pcVar4 = "r == 0";
                              uVar3 = 0xc5;
                            }
                          }
                          else {
                            pcVar4 = 
                            "uv_inet_ntop(addr.sin_family, &addr.sin_addr, dst, sizeof(dst)) == 0";
                            uVar3 = 0xc0;
                          }
                        }
                        else {
                          pcVar4 = 
                          "uv_udp_getsockname(&client, (struct sockaddr*) &addr, &addr_len) == 0";
                          uVar3 = 0xbf;
                        }
                      }
                      else {
                        pcVar4 = "r == 0";
                        uVar3 = 0xbc;
                      }
                    }
                    else {
                      pcVar4 = 
                      "9 == snprintf(data, sizeof(data), \"PING%5u\", uv_os_getpid() & 0xFFFF)";
                      uVar3 = 0xb2;
                    }
                  }
                  else {
                    pcVar4 = "uv_inet_ntop(addr.sin_family, &addr.sin_addr, dst, sizeof(dst)) == 0";
                    uVar3 = 0xae;
                  }
                }
                else {
                  pcVar4 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
                  uVar3 = 0xad;
                }
              }
              else {
                pcVar4 = "r == 0";
                uVar3 = 0xab;
              }
            }
            else {
              pcVar4 = "r == 0";
              uVar3 = 0xa8;
            }
          }
          else {
            pcVar4 = "uv_inet_ntop(addr6.sin6_family, &addr6.sin6_addr, dst, sizeof(dst)) == 0";
            uVar3 = 0xa4;
          }
        }
        else {
          pcVar4 = "uv_udp_getsockname(&server, (struct sockaddr*) &addr6, &addr6_len) == 0";
          uVar3 = 0xa3;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0xa0;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x9d;
    }
  }
  else {
    pcVar4 = "0 == uv_ip6_addr(\"::0\", TEST_PORT, &addr6)";
    uVar3 = 0x9a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

static void do_test(uv_udp_recv_cb recv_cb, int bind_flags) {
  struct sockaddr_in6 addr6;
  struct sockaddr_in addr;
  int addr6_len;
  int addr_len;
  uv_buf_t buf;
  char dst[256];
  int r;

  ASSERT(0 == uv_ip6_addr("::0", TEST_PORT, &addr6));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr6, bind_flags);
  ASSERT(r == 0);

  addr6_len = sizeof(addr6);
  ASSERT(uv_udp_getsockname(&server, (struct sockaddr*) &addr6, &addr6_len) == 0);
  ASSERT(uv_inet_ntop(addr6.sin6_family, &addr6.sin6_addr, dst, sizeof(dst)) == 0);
  printf("on [%.*s]:%d\n", (int) sizeof(dst), dst, addr6.sin6_port);

  r = uv_udp_recv_start(&server, alloc_cb, recv_cb);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(uv_inet_ntop(addr.sin_family, &addr.sin_addr, dst, sizeof(dst)) == 0);
  printf("to [%.*s]:%d\n", (int) sizeof(dst), dst, addr.sin_port);

  /* Create some unique data to send */
  ASSERT(9 == snprintf(data, sizeof(data), "PING%5u", uv_os_getpid() & 0xFFFF));
  buf = uv_buf_init(data, 9);
  printf("sending %s\n", data);

  r = uv_udp_send(&req_,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

  addr_len = sizeof(addr);
  ASSERT(uv_udp_getsockname(&client, (struct sockaddr*) &addr, &addr_len) == 0);
  ASSERT(uv_inet_ntop(addr.sin_family, &addr.sin_addr, dst, sizeof(dst)) == 0);
  printf("from [%.*s]:%d\n", (int) sizeof(dst), dst, addr.sin_port);
  client_port = addr.sin_port;

  r = uv_timer_init(uv_default_loop(), &timeout);
  ASSERT(r == 0);

  r = uv_timer_start(&timeout, timeout_cb, 500, 0);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(send_cb_called == 0);
  ASSERT(recv_cb_called == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 3);

  MAKE_VALGRIND_HAPPY();
}